

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueueBenchmark.cpp
# Opt level: O2

void pinThread(int cpu)

{
  int iVar1;
  pthread_t __th;
  cpu_set_t cpuset;
  
  if (-1 < cpu) {
    cpuset.__bits[0xe] = 0;
    cpuset.__bits[0xf] = 0;
    cpuset.__bits[0xc] = 0;
    cpuset.__bits[0xd] = 0;
    cpuset.__bits[10] = 0;
    cpuset.__bits[0xb] = 0;
    cpuset.__bits[8] = 0;
    cpuset.__bits[9] = 0;
    cpuset.__bits[6] = 0;
    cpuset.__bits[7] = 0;
    cpuset.__bits[4] = 0;
    cpuset.__bits[5] = 0;
    cpuset.__bits[2] = 0;
    cpuset.__bits[3] = 0;
    cpuset.__bits[0] = 0;
    cpuset.__bits[1] = 0;
    if ((uint)cpu < 0x400) {
      cpuset.__bits[(uint)cpu >> 6] = cpuset.__bits[(uint)cpu >> 6] | 1L << ((byte)cpu & 0x3f);
    }
    __th = pthread_self();
    iVar1 = pthread_setaffinity_np(__th,0x80,(cpu_set_t *)&cpuset);
    if (iVar1 == -1) {
      perror("pthread_setaffinity_no");
      exit(1);
    }
  }
  return;
}

Assistant:

void pinThread(int cpu) {
  if (cpu < 0) {
    return;
  }
  cpu_set_t cpuset;
  CPU_ZERO(&cpuset);
  CPU_SET(cpu, &cpuset);
  if (pthread_setaffinity_np(pthread_self(), sizeof(cpu_set_t), &cpuset) ==
      -1) {
    perror("pthread_setaffinity_no");
    exit(1);
  }
}